

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O2

uint32_t __thiscall spvtools::opt::Module::GetGlobalValue(Module *this,Op opcode)

{
  Instruction *this_00;
  uint32_t uVar1;
  
  this_00 = &(this->types_values_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  do {
    this_00 = *(Instruction **)
               ((long)&this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction> + 8);
    if (this_00 == &(this->types_values_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_)
    {
      return 0;
    }
  } while (this_00->opcode_ != opcode);
  if (this_00->has_result_id_ != true) {
    return 0;
  }
  uVar1 = Instruction::GetSingleWordOperand(this_00,(uint)this_00->has_type_id_);
  return uVar1;
}

Assistant:

uint32_t Module::GetGlobalValue(spv::Op opcode) const {
  for (auto& inst : types_values_) {
    if (inst.opcode() == opcode) return inst.result_id();
  }
  return 0;
}